

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

Test * __thiscall
testing::internal::
TestFactoryImpl<(anonymous_namespace)::BuildSystemFrontendTest_singleNodeBuildLogsMissingInputs_Test>
::CreateTest(TestFactoryImpl<(anonymous_namespace)::BuildSystemFrontendTest_singleNodeBuildLogsMissingInputs_Test>
             *this)

{
  Test *this_00;
  TestFactoryImpl<(anonymous_namespace)::BuildSystemFrontendTest_singleNodeBuildLogsMissingInputs_Test>
  *this_local;
  
  this_00 = (Test *)operator_new(0x228);
  anon_unknown.dwarf_e7fc::BuildSystemFrontendTest_singleNodeBuildLogsMissingInputs_Test::
  BuildSystemFrontendTest_singleNodeBuildLogsMissingInputs_Test
            ((BuildSystemFrontendTest_singleNodeBuildLogsMissingInputs_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }